

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O3

SequenceParser * __thiscall
ASDCP::DCData::SequenceParser::OpenRead(SequenceParser *this,string *filename)

{
  void *pvVar1;
  h__SequenceParser *this_00;
  
  this_00 = (h__SequenceParser *)operator_new(0x90);
  h__SequenceParser::h__SequenceParser(this_00);
  pvVar1 = (void *)filename->_M_string_length;
  if (pvVar1 != (void *)0x0) {
    BytestreamParser::~BytestreamParser((BytestreamParser *)((long)pvVar1 + 0x50));
    FileList::~FileList((FileList *)((long)pvVar1 + 0x10));
  }
  operator_delete(pvVar1,0x90);
  filename->_M_string_length = (size_type)this_00;
  h__SequenceParser::OpenRead((h__SequenceParser *)this,(string *)this_00);
  if (*(int *)&this->_vptr_SequenceParser < 0) {
    filename->_M_string_length = 0;
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::SequenceParser::OpenRead(const std::string& filename) const
{
  const_cast<ASDCP::DCData::SequenceParser*>(this)->m_Parser = new h__SequenceParser;

  Result_t result = m_Parser->OpenRead(filename);

  if ( ASDCP_FAILURE(result) )
    const_cast<ASDCP::DCData::SequenceParser*>(this)->m_Parser.release();

  return result;
}